

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

UnaryAssertionOperator slang::ast::getUnaryOp(TokenKind kind)

{
  UnaryAssertionOperator UVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,kind);
  if (0xe1 < iVar2) {
    if (iVar2 < 0x10d) {
      UVar1 = Not;
      if (iVar2 != 0xe2) {
        return SAlways;
      }
    }
    else {
      if (iVar2 != 0x10d) {
        return SNextTime;
      }
      UVar1 = SEventually;
    }
    return UVar1;
  }
  if (iVar2 == 0x5f) {
    return Always;
  }
  if (iVar2 == 0xa3) {
    return Eventually;
  }
  return NextTime;
}

Assistant:

static UnaryAssertionOperator getUnaryOp(TokenKind kind) {
    // clang-format off
    switch (kind) {
        case TokenKind::NotKeyword: return UnaryAssertionOperator::Not;
        case TokenKind::NextTimeKeyword: return UnaryAssertionOperator::NextTime;
        case TokenKind::SNextTimeKeyword: return UnaryAssertionOperator::SNextTime;
        case TokenKind::AlwaysKeyword: return UnaryAssertionOperator::Always;
        case TokenKind::SAlwaysKeyword: return UnaryAssertionOperator::SAlways;
        case TokenKind::EventuallyKeyword: return UnaryAssertionOperator::Eventually;
        case TokenKind::SEventuallyKeyword: return UnaryAssertionOperator::SEventually;
        default: SLANG_UNREACHABLE;
    }
    // clang-format on
}